

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int prvTidyHTMLVersion(TidyDocImpl *doc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool local_40;
  Bool html5;
  Bool html4;
  Bool xhtml;
  TidyDoctypeModes dtmode;
  uint dtver;
  uint vers;
  uint score;
  uint j;
  uint i;
  TidyDocImpl *doc_local;
  
  vers = 0;
  dtver = 0;
  uVar1 = doc->lexer->versions;
  uVar2 = doc->lexer->doctype;
  iVar3 = (int)(doc->config).value[0xe].v;
  if (((int)(doc->config).value[100].v != 0) || (bVar4 = false, doc->lexer->isvoyager != no)) {
    bVar4 = (int)(doc->config).value[0x21].v == 0;
  }
  bVar5 = true;
  if ((iVar3 != 3) && (bVar5 = true, iVar3 != 4)) {
    bVar5 = (uVar2 & 0x1ffc) != 0;
  }
  local_40 = false;
  if (!bVar5) {
    local_40 = iVar3 == 2 || iVar3 == 0;
  }
  if ((bVar4) && (uVar2 == 0)) {
    doc_local._4_4_ = 0x40000;
  }
  else if (uVar2 == 0) {
    doc_local._4_4_ = 0x20000;
  }
  else if ((bVar4) || (uVar2 != 0x60000)) {
    if ((bVar4) && ((local_40 && ((uVar1 & 0x60000) == 0x40000)))) {
      doc_local._4_4_ = 0x40000;
    }
    else {
      score = 0;
      while (W3C_Doctypes[score].name != (ctmbstr)0x0) {
        if (((((!bVar4) || ((W3C_Doctypes[score].vers & 0x41f00) != 0)) &&
             ((!bVar5 || ((W3C_Doctypes[score].vers & 0x1ffc) != 0)))) &&
            ((uVar1 & W3C_Doctypes[score].vers) != 0)) &&
           ((W3C_Doctypes[score].score < dtver || (dtver == 0)))) {
          dtver = W3C_Doctypes[score].score;
          vers = score;
        }
        score = score + 1;
      }
      if (dtver == 0) {
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = W3C_Doctypes[vers].vers;
      }
    }
  }
  else {
    doc_local._4_4_ = 0x20000;
  }
  return doc_local._4_4_;
}

Assistant:

int TY_(HTMLVersion)(TidyDocImpl* doc)
{
    uint i;
    uint j = 0;
    uint score = 0;
    uint vers = doc->lexer->versions;
    uint dtver = doc->lexer->doctype;
    TidyDoctypeModes dtmode = (TidyDoctypeModes)cfg(doc, TidyDoctypeMode);
    Bool xhtml = (cfgBool(doc, TidyXmlOut) || doc->lexer->isvoyager) &&
                 !cfgBool(doc, TidyHtmlOut);
    Bool html4 = ((dtmode == TidyDoctypeStrict) || (dtmode == TidyDoctypeLoose) ||
                  (VERS_HMTL40PX & dtver) ? yes : no);
    Bool html5 = (!html4 && ((dtmode == TidyDoctypeAuto) ||
                  (dtmode == TidyDoctypeHtml5)) ? yes : no);

    if (xhtml && dtver == VERS_UNKNOWN) return XH50;
    if (dtver == VERS_UNKNOWN) return HT50;
    /* Issue #167 - if NOT XHTML, and doctype is default VERS_HTML5, then return HT50 */
    if (!xhtml && (dtver == VERS_HTML5)) return HT50;
    /* Issue #377 - If xhtml and (doctype == html5) and constrained vers contains XH50 return that,
       and really if tidy defaults to 'html5', then maybe 'auto' should also apply! */
    if (xhtml && html5 && ((vers & VERS_HTML5) == XH50)) return XH50;

    for (i = 0; W3C_Doctypes[i].name; ++i)
    {
        if ((xhtml && !(VERS_XHTML & W3C_Doctypes[i].vers)) ||
            (html4 && !(VERS_HMTL40PX & W3C_Doctypes[i].vers)))
            continue;

        if (vers & W3C_Doctypes[i].vers &&
            (W3C_Doctypes[i].score < score || !score))
        {
            score = W3C_Doctypes[i].score;
            j = i;
        }
    }

    if (score)
        return W3C_Doctypes[j].vers;

    return VERS_UNKNOWN;
}